

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_MatcherFailure_x_iutest_x_NanSensitiveLongDoubleNear_Test::Body
          (iu_MatcherFailure_x_iutest_x_NanSensitiveLongDoubleNear_Test *this)

{
  TestFlag *pTVar1;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  string local_230;
  string local_210;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  undefined1 local_198 [32];
  longdouble local_178;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_198._0_8_ = &PTR__IMatcher_00223fa8;
  local_198._26_6_ = 0;
  local_198._16_8_ = SUB108((longdouble)1,0);
  local_198._24_2_ = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
  local_178 = (longdouble)(anonymous_namespace)::ld0._0_10_;
  iutest::detail::NanSensitiveFloatingPointNearMatcher<long_double>::operator()
            (&iutest_ar,(NanSensitiveFloatingPointNearMatcher<long_double> *)local_198,
             (longdouble *)(anonymous_namespace)::ld0);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<long_double>(&local_230,(longdouble *)(anonymous_namespace)::ld0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_210,(detail *)local_230._M_dataplus._M_p,
               "NanSensitiveLongDoubleNear(1.0l, ld0)",(char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x235,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar1 = iutest::TestFlag::GetInstance();
  pTVar1->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Near: ",(allocator<char> *)&local_1c8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x235,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(MatcherFailure, NanSensitiveLongDoubleNear)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(ld0, NanSensitiveLongDoubleNear(1.0l, ld0)), "Near: " );
}